

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_robertson_constraints.c
# Opt level: O3

int f(sunrealtype t,N_Vector y,N_Vector ydot,void *user_data)

{
  double *pdVar1;
  double *pdVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  pdVar1 = *(double **)((long)y->content + 0x10);
  pdVar2 = *(double **)((long)ydot->content + 0x10);
  dVar3 = *pdVar1;
  dVar4 = pdVar1[1];
  dVar5 = dVar4 * 10000.0 * pdVar1[2];
  *pdVar2 = dVar3 * -0.04 + dVar5;
  pdVar2[1] = -(dVar4 * 30000000.0) * dVar4 + (dVar3 * 0.04 - dVar5);
  pdVar2[2] = dVar4 * dVar4 * 30000000.0;
  return 0;
}

Assistant:

static int f(sunrealtype t, N_Vector y, N_Vector ydot, void* user_data)
{
  sunrealtype u = NV_Ith_S(y, 0); /* access current solution */
  sunrealtype v = NV_Ith_S(y, 1);
  sunrealtype w = NV_Ith_S(y, 2);

  /* Fill in ODE RHS function */
  NV_Ith_S(ydot, 0) = -0.04 * u + 1.e4 * v * w;
  NV_Ith_S(ydot, 1) = 0.04 * u - 1.e4 * v * w - 3.e7 * v * v;
  NV_Ith_S(ydot, 2) = 3.e7 * v * v;

  return 0; /* Return with success */
}